

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

bool iutest::internal::
     iuOperatorEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
               (basic_string_view<char,_std::char_traits<char>_> *v1,
               basic_string_view<char,_std::char_traits<char>_> *v2)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *v2_local;
  basic_string_view<char,_std::char_traits<char>_> *v1_local;
  
  bVar1 = std::operator==(*v1,*v2);
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}